

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_stringsegment.cpp
# Opt level: O2

UChar32 __thiscall icu_63::numparse::impl::StringSegment::getCodePoint(StringSegment *this)

{
  char16_t cVar1;
  UChar32 UVar2;
  uint uVar3;
  
  cVar1 = icu_63::UnicodeString::doCharAt(&this->fStr,this->fStart);
  if ((((ushort)cVar1 & 0xfc00) == 0xd800) && (this->fStart + 1 < this->fEnd)) {
    UVar2 = icu_63::UnicodeString::char32At(&this->fStr,this->fStart);
    return UVar2;
  }
  uVar3 = 0xffffffff;
  if ((cVar1 & 0xf800U) != 0xd800) {
    uVar3 = (uint)(ushort)cVar1;
  }
  return uVar3;
}

Assistant:

UChar32 StringSegment::getCodePoint() const {
    char16_t lead = fStr.charAt(fStart);
    if (U16_IS_LEAD(lead) && fStart + 1 < fEnd) {
        return fStr.char32At(fStart);
    } else if (U16_IS_SURROGATE(lead)) {
        return -1;
    } else {
        return lead;
    }
}